

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

size_t detect_system_thread_count(void)

{
  char *__nptr;
  long thread_count;
  char *nproc_str;
  
  __nptr = getenv("NPROC");
  if (((__nptr == (char *)0x0) ||
      (nproc_str = (char *)strtol(__nptr,(char **)0x0,10), (long)nproc_str < 1)) &&
     (nproc_str = (char *)get_system_thread_count(), (long)nproc_str < 1)) {
    nproc_str = (char *)0x2;
  }
  return (size_t)nproc_str;
}

Assistant:

size_t detect_system_thread_count(void) {
    const char* nproc_str;
    long thread_count;
    if ((nproc_str = getenv("NPROC")) &&
        (thread_count = strtol(nproc_str, NULL, 10)) > 0)
        return thread_count;
    if ((thread_count = get_system_thread_count()) > 0)
        return thread_count;
    return DEFAULT_THREAD_COUNT;
}